

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int x509_name_oneline(X509_NAME *a,char *buf,size_t size)

{
  int iVar1;
  uint uVar2;
  BUF_MEM *in_RAX;
  BIO_METHOD *type;
  BIO *out;
  size_t __n;
  BUF_MEM *biomem;
  
  biomem = in_RAX;
  type = BIO_s_mem();
  out = BIO_new(type);
  if (out == (BIO *)0x0) {
    uVar2 = 1;
  }
  else {
    iVar1 = X509_NAME_print_ex(out,(X509_NAME *)a,0,0x30000);
    BIO_ctrl(out,0x73,0,&biomem);
    __n = 0x3fff;
    if (biomem->length < 0x3fff) {
      __n = biomem->length;
    }
    memcpy(buf,biomem->data,__n);
    buf[__n] = '\0';
    BIO_free(out);
    uVar2 = (uint)(iVar1 == 0);
  }
  return uVar2;
}

Assistant:

static int x509_name_oneline(X509_NAME *a, char *buf, size_t size)
{
#if 0
  return X509_NAME_oneline(a, buf, size);
#else
  BIO *bio_out = BIO_new(BIO_s_mem());
  BUF_MEM *biomem;
  int rc;

  if(!bio_out)
    return 1; /* alloc failed! */

  rc = X509_NAME_print_ex(bio_out, a, 0, XN_FLAG_SEP_SPLUS_SPC);
  BIO_get_mem_ptr(bio_out, &biomem);

  if((size_t)biomem->length < size)
    size = biomem->length;
  else
    size--; /* don't overwrite the buffer end */

  memcpy(buf, biomem->data, size);
  buf[size]=0;

  BIO_free(bio_out);

  return !rc;
#endif
}